

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<QAbstractTextDocumentLayout::Selection>::data
          (QList<QAbstractTextDocumentLayout::Selection> *this)

{
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *this_00;
  Selection *pSVar1;
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *in_RDI;
  
  detach((QList<QAbstractTextDocumentLayout::Selection> *)0x8164bc);
  this_00 = (QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)
            QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::operator->(in_RDI);
  pSVar1 = QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::data(this_00);
  return pSVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }